

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O2

int tool_debug_cb(CURL *handle,curl_infotype type,char *data,size_t size,void *userdata)

{
  trace tVar1;
  GlobalConfig *config;
  byte *__filename;
  char cVar2;
  uint uVar3;
  time_t tVar4;
  tm *ptVar5;
  FILE *pFVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  FILE *__stream;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  timeval tVar13;
  char timebuf [20];
  time_t secs;
  
  config = *(GlobalConfig **)((long)userdata + 0x468);
  __stream = (FILE *)config->errors;
  if (config->tracetime == true) {
    tVar13 = tvnow();
    if (tool_debug_cb_known_offset != '\x01') {
      tVar4 = time((time_t *)0x0);
      tool_debug_cb::epoch_offset = tVar4 - tVar13.tv_sec;
      tool_debug_cb_known_offset = '\x01';
    }
    secs = tool_debug_cb::epoch_offset + tVar13.tv_sec;
    ptVar5 = localtime(&secs);
    curl_msnprintf(timebuf,0x14,"%02d:%02d:%02d.%06ld ",ptVar5->tm_hour,ptVar5->tm_min,
                   ptVar5->tm_sec,tVar13.tv_usec);
  }
  else {
    timebuf[0] = '\0';
  }
  pFVar6 = (FILE *)config->trace_stream;
  if (pFVar6 == (FILE *)0x0) {
    __filename = (byte *)config->trace_dump;
    if (*__filename == 0x2d) {
      pFVar6 = _stdout;
      if (__filename[1] != 0) {
LAB_0010b945:
        pFVar6 = fopen64((char *)__filename,"w");
        config->trace_stream = (FILE *)pFVar6;
        config->trace_fopened = true;
        goto LAB_0010b964;
      }
    }
    else {
      uVar3 = *__filename - 0x25;
      if (uVar3 == 0) {
        uVar3 = (uint)__filename[1];
      }
      if (uVar3 != 0) goto LAB_0010b945;
      pFVar6 = (FILE *)config->errors;
    }
    config->trace_stream = (FILE *)pFVar6;
  }
LAB_0010b964:
  if (pFVar6 != (FILE *)0x0) {
    __stream = pFVar6;
  }
  if (__stream == (FILE *)0x0) {
    warnf(config,"Failed to create/open output");
    return 0;
  }
  tVar1 = config->tracetype;
  uVar11 = (ulong)type;
  if (tVar1 == TRACE_PLAIN) {
    if (type - CURLINFO_DATA_IN < 4) {
      if (tool_debug_cb_traced_data != '\0') {
        return 0;
      }
      if (config->isatty == true) {
        if (__stream == _stderr) {
          return 0;
        }
        if (__stream == _stdout) {
          return 0;
        }
      }
      if (tool_debug_cb::newl == false) {
        curl_mfprintf(__stream,"%s%s ",timebuf,tool_debug_cb::s_infotype[uVar11]);
      }
      curl_mfprintf(__stream,"[%zd bytes data]\n",size);
      tool_debug_cb::newl = false;
      tool_debug_cb_traced_data = 1;
      return 0;
    }
    if (type < CURLINFO_HEADER_OUT) {
      if (tool_debug_cb::newl == false) {
        curl_mfprintf(__stream,"%s%s ",timebuf,tool_debug_cb::s_infotype[uVar11]);
      }
      fwrite(data,size,1,__stream);
      if (size != 0) {
        cVar2 = data[size - 1];
LAB_0010bd66:
        tool_debug_cb::newl = cVar2 != '\n';
        tool_debug_cb_traced_data = 0;
        return 0;
      }
    }
    else {
      if (type != CURLINFO_HEADER_OUT) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      if (size != 0) {
        lVar10 = 0;
        do {
          lVar8 = -1;
          pcVar7 = data;
          while( true ) {
            if (lVar10 - size == lVar8) {
              if (tool_debug_cb::newl == false) {
                curl_mfprintf(__stream,"%s%s ",timebuf,">");
              }
              fwrite(data + lVar10,size - lVar10,1,__stream);
              cVar2 = data[size - 1];
              goto LAB_0010bd66;
            }
            if (pcVar7[lVar10] == '\n') break;
            lVar8 = lVar8 + -1;
            pcVar7 = pcVar7 + 1;
          }
          if (tool_debug_cb::newl == false) {
            curl_mfprintf(__stream,"%s%s ",timebuf,">");
          }
          pcVar7 = data + lVar10;
          lVar10 = lVar10 - lVar8;
          fwrite(pcVar7,-lVar8,1,__stream);
          tool_debug_cb::newl = false;
        } while( true );
      }
    }
    tool_debug_cb::newl = false;
    tool_debug_cb_traced_data = 0;
    return 0;
  }
  switch(uVar11) {
  case 0:
    curl_mfprintf(__stream,"%s== Info: %s",timebuf,data);
    return 0;
  case 1:
    pcVar7 = "<= Recv header";
    break;
  case 2:
    pcVar7 = "=> Send header";
    break;
  case 3:
    pcVar7 = "<= Recv data";
    break;
  case 4:
    pcVar7 = "=> Send data";
    break;
  case 5:
    pcVar7 = "<= Recv SSL data";
    break;
  case 6:
    pcVar7 = "=> Send SSL data";
    break;
  default:
    goto switchD_0010ba4c_default;
  }
  lVar10 = 0x10;
  if (tVar1 == TRACE_ASCII) {
    lVar10 = 0x40;
  }
  curl_mfprintf(__stream,"%s%s, %zd bytes (0x%zx)\n",timebuf,pcVar7,size,size);
  for (uVar11 = 0; uVar11 < size; uVar11 = uVar11 + lVar10) {
    curl_mfprintf(__stream,"%04zx: ",uVar11);
    uVar9 = uVar11;
    lVar8 = lVar10;
    if (tVar1 == TRACE_BIN) {
      while (bVar12 = lVar8 != 0, lVar8 = lVar8 + -1, bVar12) {
        if (uVar9 < size) {
          curl_mfprintf(__stream,"%02x ",data[uVar9]);
        }
        else {
          fputs("   ",__stream);
        }
        uVar9 = uVar9 + 1;
      }
    }
    lVar8 = 0;
    pcVar7 = data + 2;
LAB_0010bc4a:
    if ((lVar10 == lVar8) || (size <= uVar11 + lVar8)) goto LAB_0010bd03;
    if (tVar1 != TRACE_ASCII) {
      cVar2 = pcVar7[uVar11 - 2];
      if (cVar2 < ' ') {
        cVar2 = '.';
      }
      curl_mfprintf(__stream,"%c",cVar2);
      goto LAB_0010bce8;
    }
    cVar2 = pcVar7[uVar11 - 2];
    if ((size <= uVar11 + lVar8 + 1) || (cVar2 != '\r')) {
      if (cVar2 < ' ') {
        cVar2 = '.';
      }
LAB_0010bcbb:
      curl_mfprintf(__stream,"%c",cVar2);
      if (((uVar11 + lVar8 + 2 < size) && (pcVar7[uVar11 - 1] == '\r')) && (pcVar7[uVar11] == '\n'))
      {
        uVar11 = (uVar11 + lVar8) - 0x3d;
        goto LAB_0010bd03;
      }
LAB_0010bce8:
      lVar8 = lVar8 + 1;
      pcVar7 = pcVar7 + 1;
      goto LAB_0010bc4a;
    }
    cVar2 = '.';
    if (pcVar7[uVar11 - 1] != '\n') goto LAB_0010bcbb;
    uVar11 = (uVar11 + lVar8) - 0x3e;
LAB_0010bd03:
    fputc(10,__stream);
  }
  fflush(__stream);
switchD_0010ba4c_default:
  return 0;
}

Assistant:

int tool_debug_cb(CURL *handle, curl_infotype type,
                  char *data, size_t size,
                  void *userdata)
{
  struct OperationConfig *operation = userdata;
  struct GlobalConfig *config = operation->global;
  FILE *output = config->errors;
  const char *text;
  struct timeval tv;
  struct tm *now;
  char timebuf[20];
  time_t secs;
  static time_t epoch_offset;
  static int    known_offset;

  (void)handle; /* not used */

  if(config->tracetime) {
    tv = tvnow();
    if(!known_offset) {
      epoch_offset = time(NULL) - tv.tv_sec;
      known_offset = 1;
    }
    secs = epoch_offset + tv.tv_sec;
    now = localtime(&secs);  /* not thread safe but we don't care */
    snprintf(timebuf, sizeof(timebuf), "%02d:%02d:%02d.%06ld ",
             now->tm_hour, now->tm_min, now->tm_sec, (long)tv.tv_usec);
  }
  else
    timebuf[0] = 0;

  if(!config->trace_stream) {
    /* open for append */
    if(!strcmp("-", config->trace_dump))
      config->trace_stream = stdout;
    else if(!strcmp("%", config->trace_dump))
      /* Ok, this is somewhat hackish but we do it undocumented for now */
      config->trace_stream = config->errors;  /* aka stderr */
    else {
      config->trace_stream = fopen(config->trace_dump, FOPEN_WRITETEXT);
      config->trace_fopened = TRUE;
    }
  }

  if(config->trace_stream)
    output = config->trace_stream;

  if(!output) {
    warnf(config, "Failed to create/open output");
    return 0;
  }

  if(config->tracetype == TRACE_PLAIN) {
    /*
     * This is the trace look that is similar to what libcurl makes on its
     * own.
     */
    static const char * const s_infotype[] = {
      "*", "<", ">", "{", "}", "{", "}"
    };
    size_t i;
    size_t st = 0;
    static bool newl = FALSE;
    static bool traced_data = FALSE;

    switch(type) {
    case CURLINFO_HEADER_OUT:
      if(size > 0) {
        for(i = 0; i < size - 1; i++) {
          if(data[i] == '\n') { /* LF */
            if(!newl) {
              fprintf(output, "%s%s ", timebuf, s_infotype[type]);
            }
            (void)fwrite(data + st, i - st + 1, 1, output);
            st = i + 1;
            newl = FALSE;
          }
        }
        if(!newl)
          fprintf(output, "%s%s ", timebuf, s_infotype[type]);
        (void)fwrite(data + st, i - st + 1, 1, output);
      }
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
      if(!newl)
        fprintf(output, "%s%s ", timebuf, s_infotype[type]);
      (void)fwrite(data, size, 1, output);
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_DATA_OUT:
    case CURLINFO_DATA_IN:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT:
      if(!traced_data) {
        /* if the data is output to a tty and we're sending this debug trace
           to stderr or stdout, we don't display the alert about the data not
           being shown as the data _is_ shown then just not via this
           function */
        if(!config->isatty || ((output != stderr) && (output != stdout))) {
          if(!newl)
            fprintf(output, "%s%s ", timebuf, s_infotype[type]);
          fprintf(output, "[%zd bytes data]\n", size);
          newl = FALSE;
          traced_data = TRUE;
        }
      }
      break;
    default: /* nada */
      newl = FALSE;
      traced_data = FALSE;
      break;
    }

    return 0;
  }

#ifdef CURL_DOES_CONVERSIONS
  /* Special processing is needed for CURLINFO_HEADER_OUT blocks
   * if they contain both headers and data (separated by CRLFCRLF).
   * We dump the header text and then switch type to CURLINFO_DATA_OUT.
   */
  if((type == CURLINFO_HEADER_OUT) && (size > 4)) {
    size_t i;
    for(i = 0; i < size - 4; i++) {
      if(memcmp(&data[i], "\r\n\r\n", 4) == 0) {
        /* dump everything through the CRLFCRLF as a sent header */
        text = "=> Send header";
        dump(timebuf, text, output, (unsigned char *)data, i + 4,
             config->tracetype, type);
        data += i + 3;
        size -= i + 4;
        type = CURLINFO_DATA_OUT;
        data += 1;
        break;
      }
    }
  }
#endif /* CURL_DOES_CONVERSIONS */

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(output, "%s== Info: %s", timebuf, data);
    /* FALLTHROUGH */
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  }

  dump(timebuf, text, output, (unsigned char *) data, size, config->tracetype,
       type);
  return 0;
}